

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O3

int DispatchAlpha_C(uint8_t *alpha,int alpha_stride,int width,int height,uint8_t *dst,int dst_stride
                   )

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  
  if (0 < height) {
    bVar3 = 0xff;
    iVar4 = 0;
    do {
      if (0 < width) {
        uVar2 = 0;
        do {
          bVar1 = alpha[uVar2];
          dst[uVar2 * 4] = bVar1;
          bVar3 = bVar3 & bVar1;
          uVar2 = uVar2 + 1;
        } while ((uint)width != uVar2);
      }
      alpha = alpha + alpha_stride;
      dst = dst + dst_stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 != height);
    return (int)(bVar3 != 0xff);
  }
  return 0;
}

Assistant:

static int DispatchAlpha_C(const uint8_t* WEBP_RESTRICT alpha, int alpha_stride,
                           int width, int height,
                           uint8_t* WEBP_RESTRICT dst, int dst_stride) {
  uint32_t alpha_mask = 0xff;
  int i, j;

  for (j = 0; j < height; ++j) {
    for (i = 0; i < width; ++i) {
      const uint32_t alpha_value = alpha[i];
      dst[4 * i] = alpha_value;
      alpha_mask &= alpha_value;
    }
    alpha += alpha_stride;
    dst += dst_stride;
  }

  return (alpha_mask != 0xff);
}